

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

void hexdumpdwords<unsigned_char*>(string *str,uchar *buf,size_t nLength,char sep)

{
  uint32_t d;
  char *local_30;
  char *p;
  size_t sStack_20;
  char sep_local;
  size_t nLength_local;
  uchar *buf_local;
  string *str_local;
  
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)str);
  std::__cxx11::string::size();
  local_30 = (char *)std::__cxx11::string::operator[]((ulong)str);
  sStack_20 = nLength;
  nLength_local = (size_t)buf;
  while (sStack_20 != 0) {
    *local_30 = sep;
    d = get32le<unsigned_char*>((uchar *)nLength_local);
    dword2hexchars(d,local_30 + 1);
    local_30 = local_30 + 9;
    nLength_local = nLength_local + 4;
    sStack_20 = sStack_20 - 1;
  }
  return;
}

Assistant:

void hexdumpdwords(std::string &str, I buf, size_t nLength, char sep=' ')
{
    str.resize(str.size()+nLength*9);
    char *p= &str[str.size()-nLength*9];
    while(nLength--)
    {
        *p++ = sep;
        dword2hexchars(get32le(buf), p); p+=8; buf+=4;
    }
}